

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

Schema __thiscall capnp::SchemaLoader::get(SchemaLoader *this,uint64_t id,Reader brand,Schema scope)

{
  Fault local_38;
  undefined1 local_30 [32];
  
  tryGet((SchemaLoader *)local_30,(uint64_t)this,brand,(Schema)id);
  if (local_30[0] == '\x01') {
    return (Schema)(RawBrandedSchema *)local_30._8_8_;
  }
  kj::hex((CappedArray<char,_17UL> *)local_30,id);
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[29],kj::CappedArray<char,17ul>>
            (&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
             ,0x861,FAILED,(char *)0x0,"\"no schema node loaded for id\", kj::hex(id)",
             (char (*) [29])"no schema node loaded for id",(CappedArray<char,_17UL> *)local_30);
  kj::_::Debug::Fault::fatal(&local_38);
}

Assistant:

Schema SchemaLoader::get(uint64_t id, schema::Brand::Reader brand, Schema scope) const {
  KJ_IF_SOME(result, tryGet(id, brand, scope)) {
    return result;
  } else {
    KJ_FAIL_REQUIRE("no schema node loaded for id", kj::hex(id));
  }
}